

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xml_node::set_value(xml_node *this,char_t *rhs,size_t sz)

{
  xml_node_struct *header;
  bool bVar1;
  uint uVar2;
  
  header = this->_root;
  if ((header != (xml_node_struct *)0x0) &&
     ((uVar2 = (uint)header->header & 0xf, uVar2 - 3 < 4 || (uVar2 == 8)))) {
    bVar1 = impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
                      (&header->value,&header->header,0x10,rhs,sz);
    return bVar1;
  }
  return false;
}

Assistant:

PUGI__FN bool xml_node::set_value(const char_t* rhs, size_t sz)
	{
		xml_node_type type_ = _root ? PUGI__NODETYPE(_root) : node_null;

		if (type_ != node_pcdata && type_ != node_cdata && type_ != node_comment && type_ != node_pi && type_ != node_doctype)
			return false;

		return impl::strcpy_insitu(_root->value, _root->header, impl::xml_memory_page_value_allocated_mask, rhs, sz);
	}